

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_source_read_pcm_frames_from_backend
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_uint32 mVar1;
  ma_result mVar2;
  ulong uVar3;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ma_uint64 framesToRead;
  ma_uint64 framesReadThisIteration;
  ma_uint8 pDiscardBuffer [4096];
  ma_uint64 discardBufferCapInFrames;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 framesRead;
  ma_result result;
  ma_data_source_base *pDataSourceBase;
  ulong local_1068;
  long local_1060;
  undefined1 local_1058 [8];
  size_t in_stack_ffffffffffffefb0;
  ma_channel *in_stack_ffffffffffffefb8;
  ma_uint32 *in_stack_ffffffffffffefc0;
  ma_uint32 *in_stack_ffffffffffffefc8;
  ma_format *in_stack_ffffffffffffefd0;
  ma_data_source *in_stack_ffffffffffffefd8;
  int local_50;
  ma_format local_4c;
  ulong local_48;
  ma_result local_c;
  
  if (in_RSI == 0) {
    local_c = ma_data_source_get_data_format
                        (in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,
                         in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc0,
                         in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
    if (local_c == MA_SUCCESS) {
      mVar1 = ma_get_bytes_per_sample(local_4c);
      uVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(mVar1 * local_50),0);
      for (local_48 = 0; local_48 < in_RDX; local_48 = local_1060 + local_48) {
        local_1060 = 0;
        local_1068 = in_RDX - local_48;
        if (uVar3 < in_RDX - local_48) {
          local_1068 = uVar3;
        }
        mVar2 = (**(code **)*in_RDI)(in_RDI,local_1058,local_1068,&local_1060);
        if (mVar2 != MA_SUCCESS) {
          return mVar2;
        }
      }
      *in_RCX = local_48;
      local_c = MA_SUCCESS;
    }
  }
  else {
    local_c = (**(code **)*in_RDI)(in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_c;
}

Assistant:

static ma_result ma_data_source_read_pcm_frames_from_backend(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    MA_ASSERT(pDataSourceBase                 != NULL);
    MA_ASSERT(pDataSourceBase->vtable         != NULL);
    MA_ASSERT(pDataSourceBase->vtable->onRead != NULL);
    MA_ASSERT(pFramesRead != NULL);

    if (pFramesOut != NULL) {
        return pDataSourceBase->vtable->onRead(pDataSourceBase, pFramesOut, frameCount, pFramesRead);
    } else {
        /*
        No output buffer. Probably seeking forward. Read and discard. Can probably optimize this in terms of
        onSeek and onGetCursor, but need to keep in mind that the data source may not implement these functions.
        */
        ma_result result;
        ma_uint64 framesRead;
        ma_format format;
        ma_uint32 channels;
        ma_uint64 discardBufferCapInFrames;
        ma_uint8  pDiscardBuffer[4096];

        result = ma_data_source_get_data_format(pDataSource, &format, &channels, NULL, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;
        }

        discardBufferCapInFrames = sizeof(pDiscardBuffer) / ma_get_bytes_per_frame(format, channels);

        framesRead = 0;
        while (framesRead < frameCount) {
            ma_uint64 framesReadThisIteration = 0;
            ma_uint64 framesToRead = frameCount - framesRead;
            if (framesToRead > discardBufferCapInFrames) {
                framesToRead = discardBufferCapInFrames;
            }

            result = pDataSourceBase->vtable->onRead(pDataSourceBase, pDiscardBuffer, framesToRead, &framesReadThisIteration);
            if (result != MA_SUCCESS) {
                return result;
            }

            framesRead += framesReadThisIteration;
        }

        *pFramesRead = framesRead;

        return MA_SUCCESS;
    }
}